

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O1

MPP_RET os_allocator_drm_import(void *ctx,MppBufferInfo *data)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  MPP_RET MVar3;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar1 = data->fd;
  if (((byte)drm_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_drm","enter dev %d\n","os_allocator_drm_import",
               (ulong)*(uint *)((long)ctx + 4));
  }
  if (iVar1 < 1) {
    _mpp_log_l(2,"mpp_drm","Assertion %s failed at %s:%d\n",(char *)0x0,"fd_ext > 0",
               "os_allocator_drm_import",CONCAT44(uVar4,0x10e));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  MVar3 = MPP_OK;
  uVar2 = fcntl64(iVar1,0x406,3);
  data->fd = uVar2;
  data->ptr = (void *)0x0;
  if ((int)uVar2 < 1) {
    _mpp_log_l(2,"mpp_drm"," fd dup return invalid fd %d\n","os_allocator_drm_import",(ulong)uVar2);
    MVar3 = MPP_NOK;
  }
  if (((byte)drm_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_drm","leave dev %d\n","os_allocator_drm_import",
               (ulong)*(uint *)((long)ctx + 4));
  }
  return MVar3;
}

Assistant:

static MPP_RET os_allocator_drm_import(void *ctx, MppBufferInfo *data)
{
    allocator_ctx_drm *p = (allocator_ctx_drm *)ctx;
    RK_S32 fd_ext = data->fd;
    MPP_RET ret = MPP_OK;

    drm_dbg_func("enter dev %d\n", p->drm_device);

    mpp_assert(fd_ext > 0);

    data->fd = mpp_dup(fd_ext);
    data->ptr = NULL;

    if (data->fd <= 0) {
        mpp_err_f(" fd dup return invalid fd %d\n", data->fd);
        ret = MPP_NOK;
    }

    drm_dbg_func("leave dev %d\n", p->drm_device);

    return ret;
}